

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

ssize_t __thiscall smf::MidiFile::write(MidiFile *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  MidiEvent *pMVar4;
  undefined8 extraout_RAX;
  long lVar5;
  undefined4 in_register_00000034;
  ostream *out;
  MidiFile *pMVar6;
  int iVar7;
  long lVar8;
  uchar endoftrack [4];
  vector<unsigned_char,_std::allocator<unsigned_char>_> trackdata;
  
  out = (ostream *)CONCAT44(in_register_00000034,__fd);
  iVar1 = this->m_theTimeState;
  if (iVar1 == 1) {
    makeDeltaTicks(this);
  }
  std::operator<<(out,'M');
  std::operator<<(out,'T');
  std::operator<<(out,'h');
  std::operator<<(out,'d');
  writeBigEndianULong(out,6);
  writeBigEndianUShort
            (out,(ushort)(((long)(this->m_events).
                                 super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->m_events).
                                 super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start & 0x7fffffff8U) != 8));
  writeBigEndianUShort
            (out,(ushort)((uint)(*(int *)&(this->m_events).
                                          super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                *(int *)&(this->m_events).
                                         super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3));
  writeBigEndianUShort(out,(ushort)this->m_ticksPerQuarterNote);
  trackdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  trackdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  trackdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  endoftrack[0] = '\0';
  endoftrack[1] = 0xff;
  endoftrack[2] = '/';
  endoftrack[3] = '\0';
  lVar8 = 0;
  do {
    if ((int)((ulong)((long)(this->m_events).
                            super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_events).
                           super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3) <= lVar8) {
      if (iVar1 == 1) {
        makeAbsoluteTicks(this);
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&trackdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      return CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(&trackdata,0x1e240);
    if (trackdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        trackdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      trackdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           trackdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    iVar7 = 0;
    while( true ) {
      iVar3 = MidiEventList::size((this->m_events).
                                  super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar8]);
      if (iVar3 <= iVar7) break;
      pMVar4 = MidiEventList::operator[]
                         ((this->m_events).
                          super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar8],iVar7);
      if ((pMVar4->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pMVar4->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pMVar4 = MidiEventList::operator[]
                           ((this->m_events).
                            super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar8],iVar7);
        bVar2 = MidiMessage::isEndOfTrack(&pMVar4->super_MidiMessage);
        if (!bVar2) {
          pMVar6 = (MidiFile *)
                   (this->m_events).
                   super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar8];
          pMVar4 = MidiEventList::operator[]((MidiEventList *)pMVar6,iVar7);
          writeVLValue(pMVar6,(long)pMVar4->tick,&trackdata);
          pMVar4 = MidiEventList::operator[]
                             ((this->m_events).
                              super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar8],iVar7);
          iVar3 = MidiMessage::getCommandByte(&pMVar4->super_MidiMessage);
          if (iVar3 != 0xf0) {
            pMVar4 = MidiEventList::operator[]
                               ((this->m_events).
                                super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar8],iVar7);
            iVar3 = MidiMessage::getCommandByte(&pMVar4->super_MidiMessage);
            if (iVar3 != 0xf7) {
              lVar5 = 0;
              while( true ) {
                pMVar4 = MidiEventList::operator[]
                                   ((this->m_events).
                                    super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar8],iVar7);
                if (*(int *)&(pMVar4->super_MidiMessage).
                             super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                    *(int *)&(pMVar4->super_MidiMessage).
                             super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start <= lVar5) break;
                pMVar4 = MidiEventList::operator[]
                                   ((this->m_events).
                                    super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar8],iVar7);
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                          (&trackdata,
                           (pMVar4->super_MidiMessage).
                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start + lVar5);
                lVar5 = lVar5 + 1;
              }
              goto LAB_00116ed7;
            }
          }
          pMVar4 = MidiEventList::operator[]
                             ((this->m_events).
                              super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar8],iVar7);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    (&trackdata,
                     (pMVar4->super_MidiMessage).
                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
          pMVar6 = (MidiFile *)
                   (this->m_events).
                   super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar8];
          pMVar4 = MidiEventList::operator[]((MidiEventList *)pMVar6,iVar7);
          writeVLValue(pMVar6,(long)(int)(~*(uint *)&(pMVar4->super_MidiMessage).
                                                                                                          
                                                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  .
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                         *(int *)&(pMVar4->super_MidiMessage).
                                                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  .
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish),
                       &trackdata);
          lVar5 = 1;
          while( true ) {
            pMVar4 = MidiEventList::operator[]
                               ((this->m_events).
                                super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar8],iVar7);
            if (*(int *)&(pMVar4->super_MidiMessage).
                         super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                *(int *)&(pMVar4->super_MidiMessage).
                         super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start <= lVar5) break;
            pMVar4 = MidiEventList::operator[]
                               ((this->m_events).
                                super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar8],iVar7);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                      (&trackdata,
                       (pMVar4->super_MidiMessage).
                       super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar5);
            lVar5 = lVar5 + 1;
          }
        }
      }
LAB_00116ed7:
      iVar7 = iVar7 + 1;
    }
    iVar7 = (int)trackdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish -
            (int)trackdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start;
    if (((iVar7 < 3) ||
        (trackdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start[iVar7 - 3] != 0xff)) ||
       (trackdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[iVar7 - 2] != '/')) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&trackdata,endoftrack);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (&trackdata,endoftrack + 1);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (&trackdata,endoftrack + 2);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (&trackdata,endoftrack + 3);
    }
    std::operator<<(out,'M');
    std::operator<<(out,'T');
    std::operator<<(out,'r');
    std::operator<<(out,'k');
    writeBigEndianULong(out,(long)((int)trackdata.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (int)trackdata.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start));
    std::ostream::write((char *)out,
                        (long)trackdata.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

bool MidiFile::write(std::ostream& out) {
	int oldTimeState = getTickState();
	if (oldTimeState == TIME_STATE_ABSOLUTE) {
		makeDeltaTicks();
	}

	// write the header of the Standard MIDI File
	char ch;
	// 1. The characters "MThd"
	ch = 'M'; out << ch;
	ch = 'T'; out << ch;
	ch = 'h'; out << ch;
	ch = 'd'; out << ch;

	// 2. write the size of the header (always a "6" stored in unsigned long
	//    (4 bytes).
	ulong longdata = 6;
	writeBigEndianULong(out, longdata);

	// 3. MIDI file format, type 0, 1, or 2
	ushort shortdata;
	shortdata = (getNumTracks() == 1) ? 0 : 1;
	writeBigEndianUShort(out,shortdata);

	// 4. write out the number of tracks.
	shortdata = getNumTracks();
	writeBigEndianUShort(out, shortdata);

	// 5. write out the number of ticks per quarternote. (avoiding SMTPE for now)
	shortdata = getTicksPerQuarterNote();
	writeBigEndianUShort(out, shortdata);

	// now write each track.
	std::vector<uchar> trackdata;
	uchar endoftrack[4] = {0, 0xff, 0x2f, 0x00};
	int i, j, k;
	int size;
	for (i=0; i<getNumTracks(); i++) {
		trackdata.reserve(123456);   // make the track data larger than
		                             // expected data input
		trackdata.clear();
		for (j=0; j<(int)m_events[i]->size(); j++) {
			if ((*m_events[i])[j].empty()) {
				// Don't write empty m_events (probably a delete message).
				continue;
			}
			if ((*m_events[i])[j].isEndOfTrack()) {
				// Suppress end-of-track meta messages (one will be added
				// automatically after all track data has been written).
				continue;
			}
			writeVLValue((*m_events[i])[j].tick, trackdata);
			if (((*m_events[i])[j].getCommandByte() == 0xf0) ||
					((*m_events[i])[j].getCommandByte() == 0xf7)) {
				// 0xf0 == Complete sysex message (0xf0 is part of the raw MIDI).
				// 0xf7 == Raw byte message (0xf7 not part of the raw MIDI).
				// Print the first byte of the message (0xf0 or 0xf7), then
				// print a VLV length for the rest of the bytes in the message.
				// In other words, when creating a 0xf0 or 0xf7 MIDI message,
				// do not insert the VLV byte length yourself, as this code will
				// do it for you automatically.
				trackdata.push_back((*m_events[i])[j][0]); // 0xf0 or 0xf7;
				writeVLValue(((int)(*m_events[i])[j].size())-1, trackdata);
				for (k=1; k<(int)(*m_events[i])[j].size(); k++) {
					trackdata.push_back((*m_events[i])[j][k]);
				}
			} else {
				// non-sysex type of message, so just output the
				// bytes of the message:
				for (k=0; k<(int)(*m_events[i])[j].size(); k++) {
					trackdata.push_back((*m_events[i])[j][k]);
				}
			}
		}
		size = (int)trackdata.size();
		if ((size < 3) || !((trackdata[size-3] == 0xff)
				&& (trackdata[size-2] == 0x2f))) {
			trackdata.push_back(endoftrack[0]);
			trackdata.push_back(endoftrack[1]);
			trackdata.push_back(endoftrack[2]);
			trackdata.push_back(endoftrack[3]);
		}

		// now ready to write to MIDI file.

		// first write the track ID marker "MTrk":
		ch = 'M'; out << ch;
		ch = 'T'; out << ch;
		ch = 'r'; out << ch;
		ch = 'k'; out << ch;

		// A. write the size of the MIDI data to follow:
		longdata = (int)trackdata.size();
		writeBigEndianULong(out, longdata);

		// B. write the actual data
		out.write((char*)trackdata.data(), trackdata.size());
	}

	if (oldTimeState == TIME_STATE_ABSOLUTE) {
		makeAbsoluteTicks();
	}

	return true;
}